

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator_target.hpp
# Opt level: O2

Result __thiscall
ruckig::TargetCalculator<1UL,_ruckig::StandardVector>::calculate<true>
          (TargetCalculator<1UL,_ruckig::StandardVector> *this,
          InputParameter<1UL,_ruckig::StandardVector> *inp,
          Trajectory<1UL,_ruckig::StandardVector> *traj,double delta_time,bool *was_interrupted)

{
  double *t_sync;
  size_t *psVar1;
  StandardVector<Synchronization,_1UL> *pSVar2;
  char *pcVar3;
  Block *pBVar4;
  double *pdVar5;
  Profile *this_00;
  undefined8 *puVar6;
  double dVar7;
  double dVar8;
  ControlInterface CVar9;
  DurationDiscretization DVar10;
  ControlSigns CVar11;
  pointer paVar12;
  char cVar13;
  bool bVar14;
  array<double,_1UL> *paVar15;
  array<ruckig::ControlInterface,_1UL> *paVar16;
  ControlInterface *pCVar17;
  array<ruckig::Synchronization,_1UL> *paVar18;
  Synchronization *pSVar19;
  long lVar20;
  RuckigError *pRVar21;
  long lVar22;
  size_t sVar23;
  long lVar24;
  bool found_time_synchronization;
  byte bVar25;
  ulong uVar26;
  long lVar27;
  StandardVector<Block,_1UL> *__src;
  long lVar28;
  long lVar29;
  _Storage<unsigned_long,_true> _Var30;
  size_t dof;
  bool *pbVar31;
  ulong uVar32;
  pointer paVar33;
  StandardVector<Block,_1UL> *__src_00;
  double dVar34;
  double dVar35;
  double tf;
  double dVar36;
  optional<double> t_min;
  long local_f70;
  _Storage<unsigned_long,_true> local_f68;
  char local_f60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ef8;
  double local_ed8;
  optional<std::array<ruckig::Synchronization,_1UL>_> *local_ed0;
  optional<std::array<ruckig::ControlInterface,_1UL>_> *local_ec8;
  optional<std::array<double,_1UL>_> *local_ec0;
  optional<std::array<double,_1UL>_> *local_eb8;
  Synchronization *local_eb0;
  string local_ea8;
  string local_e88;
  string local_e68;
  PositionFirstOrderStep1 step1;
  
  *was_interrupted = false;
  lVar29 = 0;
  local_ed8 = delta_time;
  Trajectory<1UL,_ruckig::StandardVector>::resize<1UL,_0>(traj,0);
  psVar1 = &this->degrees_of_freedom;
  local_eb8 = &inp->min_velocity;
  local_ec0 = &inp->min_acceleration;
  local_ec8 = &inp->per_dof_control_interface;
  local_eb0 = &inp->synchronization;
  local_ed0 = &inp->per_dof_synchronization;
  pSVar2 = &this->inp_per_dof_synchronization;
  __src_00 = &this->blocks;
  pbVar31 = &(this->blocks)._M_elems[0].b.super__Optional_base<ruckig::Block::Interval,_true,_true>.
             _M_payload.super__Optional_payload_base<ruckig::Block::Interval>._M_engaged;
  local_f70 = 0;
  for (uVar26 = 0; uVar26 < *psVar1; uVar26 = uVar26 + 1) {
    paVar33 = (traj->profiles).
              super__Vector_base<std::array<ruckig::Profile,_1UL>,_std::allocator<std::array<ruckig::Profile,_1UL>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((inp->min_velocity).super__Optional_base<std::array<double,_1UL>,_true,_true>._M_payload.
        super__Optional_payload_base<std::array<double,_1UL>_>._M_engaged == true) {
      paVar15 = std::optional<std::array<double,_1UL>_>::value(local_eb8);
      dVar34 = paVar15[uVar26]._M_elems[0];
    }
    else {
      dVar34 = -(&inp->max_velocity)[uVar26]._M_elems[0];
    }
    (&this->inp_min_velocity)[uVar26]._M_elems[0] = dVar34;
    if ((inp->min_acceleration).super__Optional_base<std::array<double,_1UL>,_true,_true>._M_payload
        .super__Optional_payload_base<std::array<double,_1UL>_>._M_engaged == true) {
      paVar15 = std::optional<std::array<double,_1UL>_>::value(local_ec0);
      dVar34 = paVar15[uVar26]._M_elems[0];
    }
    else {
      dVar34 = -(&inp->max_acceleration)[uVar26]._M_elems[0];
    }
    (&this->inp_min_acceleration)[uVar26]._M_elems[0] = dVar34;
    pCVar17 = &inp->control_interface;
    if ((inp->per_dof_control_interface).
        super__Optional_base<std::array<ruckig::ControlInterface,_1UL>,_true,_true>._M_payload.
        super__Optional_payload_base<std::array<ruckig::ControlInterface,_1UL>_>._M_engaged == true)
    {
      paVar16 = std::optional<std::array<ruckig::ControlInterface,_1UL>_>::value(local_ec8);
      pCVar17 = (ControlInterface *)((long)paVar16->_M_elems + local_f70);
    }
    (&this->inp_per_dof_control_interface)[uVar26]._M_elems[0] = *pCVar17;
    pSVar19 = local_eb0;
    if ((inp->per_dof_synchronization).
        super__Optional_base<std::array<ruckig::Synchronization,_1UL>,_true,_true>._M_payload.
        super__Optional_payload_base<std::array<ruckig::Synchronization,_1UL>_>._M_engaged == true)
    {
      paVar18 = std::optional<std::array<ruckig::Synchronization,_1UL>_>::value(local_ed0);
      pSVar19 = (Synchronization *)((long)paVar18->_M_elems + local_f70);
    }
    (&this->inp_per_dof_synchronization)[uVar26]._M_elems[0] = *pSVar19;
    if ((&inp->enabled)[uVar26]._M_elems[0] == false) {
      *(double *)((long)&paVar33->_M_elems[0].p + lVar29 + 0x38U) =
           (&inp->current_position)[uVar26]._M_elems[0];
      *(double *)((long)&paVar33->_M_elems[0].v + lVar29 + 0x38U) =
           (&inp->current_velocity)[uVar26]._M_elems[0];
      *(double *)((long)&paVar33->_M_elems[0].a + lVar29 + 0x38U) =
           (&inp->current_acceleration)[uVar26]._M_elems[0];
      *(undefined8 *)((long)&paVar33->_M_elems[0].t_sum + lVar29 + 0x30U) = 0;
      pcVar3 = pbVar31 + -0x4b0;
      pcVar3[0] = '\0';
      pcVar3[1] = '\0';
      pcVar3[2] = '\0';
      pcVar3[3] = '\0';
      pcVar3[4] = '\0';
      pcVar3[5] = '\0';
      pcVar3[6] = '\0';
      pcVar3[7] = '\0';
      if (pbVar31[-600] == true) {
        pbVar31[-600] = false;
      }
      if (*pbVar31 == true) {
        *pbVar31 = false;
      }
    }
    else {
      CVar9 = (&this->inp_per_dof_control_interface)[uVar26]._M_elems[0];
      if (CVar9 == Velocity) {
        dVar34 = (&inp->max_jerk)[uVar26]._M_elems[0];
        if (ABS(dVar34) == INFINITY) {
          ruckig::BrakeProfile::get_second_order_velocity_brake_trajectory();
        }
        else {
          ruckig::BrakeProfile::get_velocity_brake_trajectory
                    ((&inp->current_acceleration)[uVar26]._M_elems[0],
                     (&inp->max_acceleration)[uVar26]._M_elems[0],
                     (&this->inp_min_acceleration)[uVar26]._M_elems[0],dVar34);
        }
        dVar36 = (&inp->current_position)[uVar26]._M_elems[0];
        dVar34 = (&inp->current_velocity)[uVar26]._M_elems[0];
        dVar7 = (&inp->current_acceleration)[uVar26]._M_elems[0];
        dVar35 = (&inp->target_velocity)[uVar26]._M_elems[0];
        dVar8 = (&inp->target_acceleration)[uVar26]._M_elems[0];
        lVar20 = 0x220;
        lVar22 = 0x228;
        lVar24 = 0x128;
        lVar27 = 0xe8;
        lVar28 = 0xa8;
LAB_001456fd:
        *(double *)((long)&paVar33->_M_elems[0].t + lVar29 + lVar28) = dVar7;
        *(double *)((long)&paVar33->_M_elems[0].t + lVar29 + lVar27) = dVar34;
        *(double *)((long)&paVar33->_M_elems[0].t + lVar29 + lVar24) = dVar36;
        *(double *)((long)&paVar33->_M_elems[0].t + lVar29 + lVar22) = dVar8;
        *(double *)((long)&paVar33->_M_elems[0].t + lVar29 + lVar20) = dVar35;
      }
      else if (CVar9 == Position) {
        dVar34 = (&inp->max_jerk)[uVar26]._M_elems[0];
        if (ABS(dVar34) == INFINITY) {
          dVar34 = (&inp->max_acceleration)[uVar26]._M_elems[0];
          if (ABS(dVar34) != INFINITY) {
            ruckig::BrakeProfile::get_second_order_position_brake_trajectory
                      ((&inp->current_velocity)[uVar26]._M_elems[0],
                       (&inp->max_velocity)[uVar26]._M_elems[0],
                       (&this->inp_min_velocity)[uVar26]._M_elems[0],dVar34,
                       (&this->inp_min_acceleration)[uVar26]._M_elems[0]);
          }
        }
        else {
          ruckig::BrakeProfile::get_position_brake_trajectory
                    ((&inp->current_velocity)[uVar26]._M_elems[0],
                     (&inp->current_acceleration)[uVar26]._M_elems[0],
                     (&inp->max_velocity)[uVar26]._M_elems[0],
                     (&this->inp_min_velocity)[uVar26]._M_elems[0],
                     (&inp->max_acceleration)[uVar26]._M_elems[0],
                     (&this->inp_min_acceleration)[uVar26]._M_elems[0],dVar34);
        }
        dVar34 = (&inp->current_position)[uVar26]._M_elems[0];
        dVar7 = (&inp->current_velocity)[uVar26]._M_elems[0];
        dVar35 = (&inp->target_position)[uVar26]._M_elems[0];
        dVar8 = (&inp->target_velocity)[uVar26]._M_elems[0];
        dVar36 = (&inp->target_acceleration)[uVar26]._M_elems[0];
        *(double *)((long)&paVar33->_M_elems[0].a + lVar29) =
             (&inp->current_acceleration)[uVar26]._M_elems[0];
        lVar20 = 0x218;
        lVar22 = 0x220;
        lVar24 = 0x228;
        lVar27 = 0x128;
        lVar28 = 0xe8;
        goto LAB_001456fd;
      }
      if (ABS((&inp->max_jerk)[uVar26]._M_elems[0]) == INFINITY) {
        if (ABS((&inp->max_acceleration)[uVar26]._M_elems[0]) != INFINITY) {
          BrakeProfile::finalize_second_order
                    ((BrakeProfile *)((long)&paVar33->_M_elems[0].brake + lVar29),
                     (double *)((long)&paVar33->_M_elems[0].p + lVar29),
                     (double *)((long)&paVar33->_M_elems[0].v + lVar29),
                     (double *)((long)&paVar33->_M_elems[0].a + lVar29));
        }
      }
      else {
        BrakeProfile::finalize
                  ((BrakeProfile *)((long)&paVar33->_M_elems[0].brake + lVar29),
                   (double *)((long)&paVar33->_M_elems[0].p + lVar29),
                   (double *)((long)&paVar33->_M_elems[0].v + lVar29),
                   (double *)((long)&paVar33->_M_elems[0].a + lVar29));
      }
      pBVar4 = (Block *)((long)&paVar33->_M_elems[0].t + lVar29);
      CVar9 = (&this->inp_per_dof_control_interface)[uVar26]._M_elems[0];
      if (CVar9 == Velocity) {
        dVar34 = (&inp->max_jerk)[uVar26]._M_elems[0];
        if (ABS(dVar34) == INFINITY) {
          ruckig::VelocitySecondOrderStep1::VelocitySecondOrderStep1
                    ((VelocitySecondOrderStep1 *)&step1,
                     *(double *)((long)&paVar33->_M_elems[0].v + lVar29),
                     *(double *)((long)&paVar33->_M_elems[0].accel + lVar29 + 0x60U),
                     (&inp->max_acceleration)[uVar26]._M_elems[0],
                     (&this->inp_min_acceleration)[uVar26]._M_elems[0]);
          cVar13 = ruckig::VelocitySecondOrderStep1::get_profile((Profile *)&step1,pBVar4);
        }
        else {
          ruckig::VelocityThirdOrderStep1::VelocityThirdOrderStep1
                    ((VelocityThirdOrderStep1 *)&step1,
                     *(double *)((long)&paVar33->_M_elems[0].v + lVar29),
                     *(double *)((long)&paVar33->_M_elems[0].a + lVar29),
                     *(double *)((long)&paVar33->_M_elems[0].accel + lVar29 + 0x60U),
                     *(double *)((long)&paVar33->_M_elems[0].accel + lVar29 + 0x68U),
                     (&inp->max_acceleration)[uVar26]._M_elems[0],
                     (&this->inp_min_acceleration)[uVar26]._M_elems[0],dVar34);
          cVar13 = ruckig::VelocityThirdOrderStep1::get_profile((Profile *)&step1,pBVar4);
        }
      }
      else {
        if (CVar9 != Position) goto LAB_001464aa;
        dVar34 = (&inp->max_jerk)[uVar26]._M_elems[0];
        if (ABS(dVar34) == INFINITY) {
          dVar34 = (&inp->max_acceleration)[uVar26]._M_elems[0];
          if (ABS(dVar34) == INFINITY) {
            ruckig::PositionFirstOrderStep1::PositionFirstOrderStep1
                      (&step1,*(double *)((long)&paVar33->_M_elems[0].p + lVar29),
                       *(double *)((long)&paVar33->_M_elems[0].accel + lVar29 + 0x58U),
                       (&inp->max_velocity)[uVar26]._M_elems[0],
                       (&this->inp_min_velocity)[uVar26]._M_elems[0]);
            cVar13 = ruckig::PositionFirstOrderStep1::get_profile((Profile *)&step1,pBVar4);
          }
          else {
            ruckig::PositionSecondOrderStep1::PositionSecondOrderStep1
                      ((PositionSecondOrderStep1 *)&step1,
                       *(double *)((long)&paVar33->_M_elems[0].p + lVar29),
                       *(double *)((long)&paVar33->_M_elems[0].v + lVar29),
                       *(double *)((long)&paVar33->_M_elems[0].accel + lVar29 + 0x58U),
                       *(double *)((long)&paVar33->_M_elems[0].accel + lVar29 + 0x60U),
                       (&inp->max_velocity)[uVar26]._M_elems[0],
                       (&this->inp_min_velocity)[uVar26]._M_elems[0],dVar34,
                       (&this->inp_min_acceleration)[uVar26]._M_elems[0]);
            cVar13 = ruckig::PositionSecondOrderStep1::get_profile((Profile *)&step1,pBVar4);
          }
        }
        else {
          ruckig::PositionThirdOrderStep1::PositionThirdOrderStep1
                    ((PositionThirdOrderStep1 *)&step1,
                     *(double *)((long)&paVar33->_M_elems[0].p + lVar29),
                     *(double *)((long)&paVar33->_M_elems[0].v + lVar29),
                     *(double *)((long)&paVar33->_M_elems[0].a + lVar29),
                     *(double *)((long)&paVar33->_M_elems[0].accel + lVar29 + 0x58U),
                     *(double *)((long)&paVar33->_M_elems[0].accel + lVar29 + 0x60U),
                     *(double *)((long)&paVar33->_M_elems[0].accel + lVar29 + 0x68U),
                     (&inp->max_velocity)[uVar26]._M_elems[0],
                     (&this->inp_min_velocity)[uVar26]._M_elems[0],
                     (&inp->max_acceleration)[uVar26]._M_elems[0],
                     (&this->inp_min_acceleration)[uVar26]._M_elems[0],dVar34);
          cVar13 = ruckig::PositionThirdOrderStep1::get_profile((Profile *)&step1,pBVar4);
        }
      }
      if (cVar13 == '\0') {
LAB_001464aa:
        dVar34 = (&inp->max_acceleration)[uVar26]._M_elems[0];
        if ((((dVar34 != 0.0) || (NAN(dVar34))) &&
            ((dVar34 = (&this->inp_min_acceleration)[uVar26]._M_elems[0], dVar34 != 0.0 ||
             (NAN(dVar34))))) &&
           ((dVar34 = (&inp->max_jerk)[uVar26]._M_elems[0], dVar34 != 0.0 || (NAN(dVar34))))) {
          pRVar21 = (RuckigError *)__cxa_allocate_exception(0x10);
          std::__cxx11::to_string(&local_f18,uVar26);
          std::operator+(&local_ef8,"error in step 1, dof: ",&local_f18);
          std::operator+(&local_f58,&local_ef8," input: ");
          InputParameter<1ul,ruckig::StandardVector>::to_string_abi_cxx11_(&local_f38,inp);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&step1
                         ,&local_f58,&local_f38);
          RuckigError::RuckigError(pRVar21,(string *)&step1);
          __cxa_throw(pRVar21,&RuckigError::typeinfo,std::runtime_error::~runtime_error);
        }
        pRVar21 = (RuckigError *)__cxa_allocate_exception(0x10);
        std::__cxx11::to_string(&local_f18,uVar26);
        std::operator+(&local_ef8,"zero limits conflict in step 1, dof: ",&local_f18);
        std::operator+(&local_f58,&local_ef8," input: ");
        InputParameter<1ul,ruckig::StandardVector>::to_string_abi_cxx11_(&local_f38,inp);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&step1,
                       &local_f58,&local_f38);
        RuckigError::RuckigError(pRVar21,(string *)&step1);
        __cxa_throw(pRVar21,&RuckigError::typeinfo,std::runtime_error::~runtime_error);
      }
      (&traj->independent_min_durations)[uVar26]._M_elems[0] = *(double *)(pbVar31 + -0x4b0);
    }
    pbVar31 = pbVar31 + 0x6f8;
    local_f70 = local_f70 + 4;
    lVar29 = lVar29 + 0x240;
  }
  DVar10 = inp->duration_discretization;
  bVar14 = (inp->minimum_duration).super__Optional_base<double,_true,_true>._M_payload.
           super__Optional_payload_base<double>._M_engaged;
  if ((*psVar1 == 1 && (bVar14 & 1U) == 0) && DVar10 != Discrete) {
    traj->duration = (this->blocks)._M_elems[0].t_min;
    memcpy((traj->profiles).
           super__Vector_base<std::array<ruckig::Profile,_1UL>,_std::allocator<std::array<ruckig::Profile,_1UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start,__src_00,0x23c);
    *(traj->cumulative_times).super__Vector_base<double,_std::allocator<double>_>._M_impl.
     super__Vector_impl_data._M_start = traj->duration;
  }
  else {
    local_f60 = '\0';
    t_sync = &traj->duration;
    t_min.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
    _M_engaged = bVar14;
    t_min.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
    _M_payload = (inp->minimum_duration).super__Optional_base<double,_true,_true>._M_payload.
                 super__Optional_payload_base<double>._M_payload;
    t_min.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
    _9_7_ = 0;
    bVar14 = synchronize(this,t_min,t_sync,(optional<unsigned_long> *)&local_f68,
                         (traj->profiles).
                         super__Vector_base<std::array<ruckig::Profile,_1UL>,_std::allocator<std::array<ruckig::Profile,_1UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,DVar10 == Discrete,local_ed8);
    if (!bVar14) {
      sVar23 = 0;
      do {
        if (*psVar1 == sVar23) {
          pRVar21 = (RuckigError *)__cxa_allocate_exception(0x10);
          std::__cxx11::to_string(&local_f58,*t_sync);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&step1
                         ,"error in time synchronization: ",&local_f58);
          RuckigError::RuckigError(pRVar21,(string *)&step1);
          __cxa_throw(pRVar21,&RuckigError::typeinfo,std::runtime_error::~runtime_error);
        }
        dVar34 = (&inp->max_acceleration)[sVar23]._M_elems[0];
        if (((dVar34 == 0.0) && (!NAN(dVar34))) ||
           ((dVar34 = (&this->inp_min_acceleration)[sVar23]._M_elems[0], dVar34 == 0.0 &&
            (!NAN(dVar34))))) break;
        dVar34 = (&inp->max_jerk)[sVar23]._M_elems[0];
        sVar23 = sVar23 + 1;
      } while ((dVar34 != 0.0) || (NAN(dVar34)));
      pRVar21 = (RuckigError *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string(&local_f58,*t_sync);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&step1,
                     "zero limits conflict with other degrees of freedom in time synchronization ",
                     &local_f58);
      RuckigError::RuckigError(pRVar21,(string *)&step1);
      __cxa_throw(pRVar21,&RuckigError::typeinfo,std::runtime_error::~runtime_error);
    }
    lVar29 = 0xa4;
    lVar20 = 0;
    for (_Var30._M_value = 0; uVar26 = *psVar1, _Var30._M_value < uVar26;
        _Var30._M_value = _Var30._M_value + 1) {
      if (((&inp->enabled)[_Var30._M_value]._M_elems[0] == true) &&
         ((&this->inp_per_dof_synchronization)[_Var30._M_value]._M_elems[0] == None)) {
        pdVar5 = (double *)((long)(this->new_phase_control)._M_elems + lVar29 * 4);
        memcpy((void *)((long)&((traj->profiles).
                                super__Vector_base<std::array<ruckig::Profile,_1UL>,_std::allocator<std::array<ruckig::Profile,_1UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_elems[0].t + lVar20),
               pdVar5 + -0x48,0x23c);
        dVar34 = *pdVar5;
        if (traj->duration <= dVar34 && dVar34 != traj->duration) {
          *t_sync = dVar34;
          local_f60 = '\x01';
          local_f68 = _Var30;
        }
      }
      lVar29 = lVar29 + 0x1be;
      lVar20 = lVar20 + 0x240;
    }
    dVar34 = traj->duration;
    *(traj->cumulative_times).super__Vector_base<double,_std::allocator<double>_>._M_impl.
     super__Vector_impl_data._M_start = dVar34;
    if (7600.0 < dVar34) {
      return ErrorTrajectoryDuration;
    }
    if ((dVar34 == 0.0) && (!NAN(dVar34))) {
      lVar29 = 0;
      for (uVar32 = 0; uVar32 < uVar26; uVar32 = uVar32 + 1) {
        memcpy((void *)((long)&((traj->profiles).
                                super__Vector_base<std::array<ruckig::Profile,_1UL>,_std::allocator<std::array<ruckig::Profile,_1UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_elems[0].t + lVar29),
               __src_00,0x23c);
        uVar26 = *psVar1;
        lVar29 = lVar29 + 0x240;
        __src_00 = __src_00 + 1;
      }
      return Working;
    }
    if ((DVar10 == Discrete) ||
       (bVar14 = std::
                 all_of<ruckig::Synchronization*,ruckig::TargetCalculator<1ul,ruckig::StandardVector>::calculate<true>(ruckig::InputParameter<1ul,ruckig::StandardVector>const&,ruckig::Trajectory<1ul,ruckig::StandardVector>&,double,bool&)::_lambda(ruckig::Synchronization)_1_>
                           (pSVar2,psVar1), !bVar14)) {
      if ((local_f60 == '\x01') &&
         (bVar14 = std::
                   any_of<ruckig::Synchronization*,ruckig::TargetCalculator<1ul,ruckig::StandardVector>::calculate<true>(ruckig::InputParameter<1ul,ruckig::StandardVector>const&,ruckig::Trajectory<1ul,ruckig::StandardVector>&,double,bool&)::_lambda(ruckig::Synchronization)_2_>
                             (pSVar2,psVar1), _Var30 = local_f68, bVar14)) {
        if (local_f60 == '\0') {
          std::__throw_bad_optional_access();
        }
        paVar33 = (traj->profiles).
                  super__Vector_base<std::array<ruckig::Profile,_1UL>,_std::allocator<std::array<ruckig::Profile,_1UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        bVar14 = is_input_collinear(this,inp,paVar33[local_f68._M_value]._M_elems[0].direction,
                                    local_f68._M_value);
        if (bVar14) {
          paVar33 = paVar33 + _Var30._M_value;
          bVar25 = 1;
          lVar29 = 0;
          for (uVar26 = 0; uVar26 < *psVar1; uVar26 = uVar26 + 1) {
            if (((&inp->enabled)[uVar26]._M_elems[0] == true) &&
               (((local_f60 != '\x01' || (uVar26 != local_f68._M_value)) &&
                (pSVar2[uVar26]._M_elems[0] == Phase)))) {
              paVar12 = (traj->profiles).
                        super__Vector_base<std::array<ruckig::Profile,_1UL>,_std::allocator<std::array<ruckig::Profile,_1UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              this_00 = (Profile *)((long)&paVar12->_M_elems[0].t + lVar29);
              tf = (traj->duration - *(double *)((long)&paVar12->_M_elems[0].brake + lVar29)) -
                   *(double *)((long)&paVar12->_M_elems[0].accel + lVar29);
              dVar34 = *(double *)((long)&paVar33->_M_elems[0].t + 8);
              dVar35 = *(double *)((long)&paVar33->_M_elems[0].t + 0x10);
              dVar36 = *(double *)((long)&paVar33->_M_elems[0].t + 0x18);
              dVar7 = *(double *)((long)&paVar33->_M_elems[0].t + 0x20);
              dVar8 = *(double *)((long)&paVar33->_M_elems[0].t + 0x28);
              puVar6 = (undefined8 *)((long)&paVar12->_M_elems[0].t + lVar29);
              *puVar6 = paVar33->_M_elems[0].t._M_elems[0];
              puVar6[1] = dVar34;
              pdVar5 = (double *)((long)&paVar12->_M_elems[0].t + lVar29 + 0x10);
              *pdVar5 = dVar35;
              pdVar5[1] = dVar36;
              pdVar5 = (double *)((long)&paVar12->_M_elems[0].t + lVar29 + 0x20);
              *pdVar5 = dVar7;
              pdVar5[1] = dVar8;
              *(double *)((long)&paVar12->_M_elems[0].t + lVar29 + 0x30) =
                   *(double *)((long)&paVar33->_M_elems[0].t + 0x30);
              CVar11 = paVar33->_M_elems[0].control_signs;
              *(ControlSigns *)((long)&paVar12->_M_elems[0].accel + lVar29 + 0x78U) = CVar11;
              CVar9 = (&this->inp_per_dof_control_interface)[uVar26]._M_elems[0];
              if (CVar9 == Velocity) {
                if (CVar11 == UDUD) {
                  dVar34 = (&inp->max_acceleration)[uVar26]._M_elems[0];
                  dVar35 = (&inp->max_jerk)[uVar26]._M_elems[0];
                  dVar36 = (&this->new_phase_control)[uVar26]._M_elems[0];
                  dVar7 = (&this->inp_min_acceleration)[uVar26]._M_elems[0];
                  if (ABS(dVar35) == INFINITY) {
                    bVar14 = Profile::
                             check_for_second_order_velocity_with_timing<(ruckig::Profile::ControlSigns)1,(ruckig::Profile::ReachedLimits)7>
                                       (this_00,tf,dVar36,dVar34,dVar7);
                  }
                  else {
                    bVar14 = Profile::
                             check_for_velocity_with_timing<(ruckig::Profile::ControlSigns)1,(ruckig::Profile::ReachedLimits)7>
                                       (this_00,tf,dVar36,dVar34,dVar7,dVar35);
                  }
                }
                else {
                  if (CVar11 != UDDU) goto LAB_00145f5e;
                  dVar34 = (&inp->max_acceleration)[uVar26]._M_elems[0];
                  dVar35 = (&inp->max_jerk)[uVar26]._M_elems[0];
                  dVar36 = (&this->new_phase_control)[uVar26]._M_elems[0];
                  dVar7 = (&this->inp_min_acceleration)[uVar26]._M_elems[0];
                  if (ABS(dVar35) == INFINITY) {
                    bVar14 = Profile::
                             check_for_second_order_velocity_with_timing<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                                       (this_00,tf,dVar36,dVar34,dVar7);
                  }
                  else {
                    bVar14 = Profile::
                             check_for_velocity_with_timing<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                                       (this_00,tf,dVar36,dVar34,dVar7,dVar35);
                  }
                }
LAB_00145f5b:
                bVar25 = bVar25 & bVar14;
              }
              else if (CVar9 == Position) {
                if (CVar11 == UDUD) {
                  dVar34 = (&inp->max_jerk)[uVar26]._M_elems[0];
                  dVar35 = (&this->new_phase_control)[uVar26]._M_elems[0];
                  if (ABS(dVar34) == INFINITY) {
                    bVar14 = Profile::
                             check_for_second_order_with_timing<(ruckig::Profile::ControlSigns)1,(ruckig::Profile::ReachedLimits)7>
                                       (this_00,tf,dVar35,-dVar35,
                                        (&inp->max_velocity)[uVar26]._M_elems[0],
                                        (&this->inp_min_velocity)[uVar26]._M_elems[0],
                                        (&inp->max_acceleration)[uVar26]._M_elems[0],
                                        (&this->inp_min_acceleration)[uVar26]._M_elems[0]);
                  }
                  else {
                    bVar14 = Profile::
                             check_with_timing<(ruckig::Profile::ControlSigns)1,(ruckig::Profile::ReachedLimits)7>
                                       (this_00,tf,dVar35,(&inp->max_velocity)[uVar26]._M_elems[0],
                                        (&this->inp_min_velocity)[uVar26]._M_elems[0],
                                        (&inp->max_acceleration)[uVar26]._M_elems[0],
                                        (&this->inp_min_acceleration)[uVar26]._M_elems[0],dVar34);
                  }
                }
                else {
                  if (CVar11 != UDDU) goto LAB_00145f5e;
                  dVar34 = (&inp->max_jerk)[uVar26]._M_elems[0];
                  if (ABS(dVar34) == INFINITY) {
                    dVar34 = (&inp->max_acceleration)[uVar26]._M_elems[0];
                    dVar35 = (&this->new_phase_control)[uVar26]._M_elems[0];
                    if (ABS(dVar34) == INFINITY) {
                      bVar14 = Profile::
                               check_for_first_order_with_timing<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                                         (this_00,tf,dVar35,(&inp->max_velocity)[uVar26]._M_elems[0]
                                          ,(&this->inp_min_velocity)[uVar26]._M_elems[0]);
                    }
                    else {
                      bVar14 = Profile::
                               check_for_second_order_with_timing<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                                         (this_00,tf,dVar35,-dVar35,
                                          (&inp->max_velocity)[uVar26]._M_elems[0],
                                          (&this->inp_min_velocity)[uVar26]._M_elems[0],dVar34,
                                          (&this->inp_min_acceleration)[uVar26]._M_elems[0]);
                    }
                  }
                  else {
                    bVar14 = Profile::
                             check_with_timing<(ruckig::Profile::ControlSigns)0,(ruckig::Profile::ReachedLimits)7>
                                       (this_00,tf,(&this->new_phase_control)[uVar26]._M_elems[0],
                                        (&inp->max_velocity)[uVar26]._M_elems[0],
                                        (&this->inp_min_velocity)[uVar26]._M_elems[0],
                                        (&inp->max_acceleration)[uVar26]._M_elems[0],
                                        (&this->inp_min_acceleration)[uVar26]._M_elems[0],dVar34);
                  }
                }
                goto LAB_00145f5b;
              }
LAB_00145f5e:
              *(ReachedLimits *)((long)&paVar12->_M_elems[0].accel + lVar29 + 0x70U) =
                   paVar33->_M_elems[0].limits;
            }
            lVar29 = lVar29 + 0x240;
          }
          if ((bVar25 != 0) &&
             (bVar14 = std::
                       all_of<ruckig::Synchronization*,ruckig::TargetCalculator<1ul,ruckig::StandardVector>::calculate<true>(ruckig::InputParameter<1ul,ruckig::StandardVector>const&,ruckig::Trajectory<1ul,ruckig::StandardVector>&,double,bool&)::_lambda(ruckig::Synchronization)_3_>
                                 (pSVar2,psVar1), bVar14)) {
            return Working;
          }
        }
      }
      pbVar31 = &(this->blocks)._M_elems[0].b.
                 super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload.
                 super__Optional_payload_base<ruckig::Block::Interval>._M_engaged;
      lVar29 = 0;
      for (uVar26 = 0; uVar26 < *psVar1; uVar26 = uVar26 + 1) {
        if (((local_f60 == '\x01') && (uVar26 == local_f68._M_value)) ||
           (bVar14 = true, pSVar2[uVar26]._M_elems[0] == None)) {
          bVar14 = DVar10 == Discrete;
        }
        if ((bVar14 & (&inp->enabled)[uVar26]._M_elems[0]) == 1) {
          paVar33 = (traj->profiles).
                    super__Vector_base<std::array<ruckig::Profile,_1UL>,_std::allocator<std::array<ruckig::Profile,_1UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          dVar34 = (traj->duration - *(double *)((long)&paVar33->_M_elems[0].brake + lVar29)) -
                   *(double *)((long)&paVar33->_M_elems[0].accel + lVar29);
          if (((pSVar2[uVar26]._M_elems[0] != TimeIfNecessary) ||
              (2.220446049250313e-16 <= ABS((&inp->target_velocity)[uVar26]._M_elems[0]))) ||
             (2.220446049250313e-16 <= ABS((&inp->target_acceleration)[uVar26]._M_elems[0]))) {
            __src = __src_00 + uVar26;
            if (4.440892098500626e-16 <= ABS(dVar34 - *(double *)(pbVar31 + -0x4b0))) {
              if ((pbVar31[-600] != true) ||
                 (4.440892098500626e-16 <= ABS(dVar34 - *(double *)(pbVar31 + -0x4a0)))) {
                if ((*pbVar31 != true) ||
                   (4.440892098500626e-16 <= ABS(dVar34 - *(double *)(pbVar31 + -0x248)))) {
                  CVar9 = (&this->inp_per_dof_control_interface)[uVar26]._M_elems[0];
                  if (CVar9 == Velocity) {
                    dVar35 = (&inp->max_jerk)[uVar26]._M_elems[0];
                    if (ABS(dVar35) == INFINITY) {
                      ruckig::VelocitySecondOrderStep2::VelocitySecondOrderStep2
                                ((VelocitySecondOrderStep2 *)&step1,dVar34,
                                 *(double *)((long)&paVar33->_M_elems[0].v + lVar29),
                                 *(double *)((long)&paVar33->_M_elems[0].accel + lVar29 + 0x60U),
                                 (&inp->max_acceleration)[uVar26]._M_elems[0],
                                 (&this->inp_min_acceleration)[uVar26]._M_elems[0]);
                      cVar13 = ruckig::VelocitySecondOrderStep2::get_profile((Profile *)&step1);
                    }
                    else {
                      ruckig::VelocityThirdOrderStep2::VelocityThirdOrderStep2
                                ((VelocityThirdOrderStep2 *)&step1,dVar34,
                                 *(double *)((long)&paVar33->_M_elems[0].v + lVar29),
                                 *(double *)((long)&paVar33->_M_elems[0].a + lVar29),
                                 *(double *)((long)&paVar33->_M_elems[0].accel + lVar29 + 0x60U),
                                 *(double *)((long)&paVar33->_M_elems[0].accel + lVar29 + 0x68U),
                                 (&inp->max_acceleration)[uVar26]._M_elems[0],
                                 (&this->inp_min_acceleration)[uVar26]._M_elems[0],dVar35);
                      cVar13 = ruckig::VelocityThirdOrderStep2::get_profile((Profile *)&step1);
                    }
                  }
                  else {
                    if (CVar9 != Position) goto LAB_001463b1;
                    dVar35 = (&inp->max_jerk)[uVar26]._M_elems[0];
                    if (ABS(dVar35) == INFINITY) {
                      dVar35 = (&inp->max_acceleration)[uVar26]._M_elems[0];
                      if (ABS(dVar35) == INFINITY) {
                        ruckig::PositionFirstOrderStep2::PositionFirstOrderStep2
                                  ((PositionFirstOrderStep2 *)&step1,dVar34,
                                   *(double *)((long)&paVar33->_M_elems[0].p + lVar29),
                                   *(double *)((long)&paVar33->_M_elems[0].accel + lVar29 + 0x58U),
                                   (&inp->max_velocity)[uVar26]._M_elems[0],
                                   (&this->inp_min_velocity)[uVar26]._M_elems[0]);
                        cVar13 = ruckig::PositionFirstOrderStep2::get_profile((Profile *)&step1);
                      }
                      else {
                        ruckig::PositionSecondOrderStep2::PositionSecondOrderStep2
                                  ((PositionSecondOrderStep2 *)&step1,dVar34,
                                   *(double *)((long)&paVar33->_M_elems[0].p + lVar29),
                                   *(double *)((long)&paVar33->_M_elems[0].v + lVar29),
                                   *(double *)((long)&paVar33->_M_elems[0].accel + lVar29 + 0x58U),
                                   *(double *)((long)&paVar33->_M_elems[0].accel + lVar29 + 0x60U),
                                   (&inp->max_velocity)[uVar26]._M_elems[0],
                                   (&this->inp_min_velocity)[uVar26]._M_elems[0],dVar35,
                                   (&this->inp_min_acceleration)[uVar26]._M_elems[0]);
                        cVar13 = ruckig::PositionSecondOrderStep2::get_profile((Profile *)&step1);
                      }
                    }
                    else {
                      ruckig::PositionThirdOrderStep2::PositionThirdOrderStep2
                                ((PositionThirdOrderStep2 *)&step1,dVar34,
                                 *(double *)((long)&paVar33->_M_elems[0].p + lVar29),
                                 *(double *)((long)&paVar33->_M_elems[0].v + lVar29),
                                 *(double *)((long)&paVar33->_M_elems[0].a + lVar29),
                                 *(double *)((long)&paVar33->_M_elems[0].accel + lVar29 + 0x58U),
                                 *(double *)((long)&paVar33->_M_elems[0].accel + lVar29 + 0x60U),
                                 *(double *)((long)&paVar33->_M_elems[0].accel + lVar29 + 0x68U),
                                 (&inp->max_velocity)[uVar26]._M_elems[0],
                                 (&this->inp_min_velocity)[uVar26]._M_elems[0],
                                 (&inp->max_acceleration)[uVar26]._M_elems[0],
                                 (&this->inp_min_acceleration)[uVar26]._M_elems[0],dVar35);
                      cVar13 = ruckig::PositionThirdOrderStep2::get_profile((Profile *)&step1);
                    }
                  }
                  if (cVar13 == '\0') {
LAB_001463b1:
                    pRVar21 = (RuckigError *)__cxa_allocate_exception(0x10);
                    std::__cxx11::to_string(&local_e68,uVar26);
                    std::operator+(&local_f38,"error in step 2 in dof: ",&local_e68);
                    std::operator+(&local_f18,&local_f38," for t sync: ");
                    std::__cxx11::to_string(&local_e88,*t_sync);
                    std::operator+(&local_ef8,&local_f18,&local_e88);
                    std::operator+(&local_f58,&local_ef8," input: ");
                    InputParameter<1ul,ruckig::StandardVector>::to_string_abi_cxx11_(&local_ea8,inp)
                    ;
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&step1,&local_f58,&local_ea8);
                    RuckigError::RuckigError(pRVar21,(string *)&step1);
                    __cxa_throw(pRVar21,&RuckigError::typeinfo,std::runtime_error::~runtime_error);
                  }
                  goto LAB_001460a4;
                }
                __src = (StandardVector<Block,_1UL> *)
                        ((long)&__src->_M_elems[0].b.
                                super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload
                                .super__Optional_payload_base<ruckig::Block::Interval>._M_payload +
                        0x10);
              }
              else {
                __src = (StandardVector<Block,_1UL> *)
                        ((long)&__src->_M_elems[0].a.
                                super__Optional_base<ruckig::Block::Interval,_true,_true>._M_payload
                                .super__Optional_payload_base<ruckig::Block::Interval>._M_payload +
                        0x10);
              }
            }
          }
          else {
            __src = (StandardVector<Block,_1UL> *)(pbVar31 + -0x6f0);
          }
          memcpy((void *)((long)&paVar33->_M_elems[0].t + lVar29),__src,0x23c);
        }
LAB_001460a4:
        lVar29 = lVar29 + 0x240;
        pbVar31 = pbVar31 + 0x6f8;
      }
    }
  }
  return Working;
}

Assistant:

Result calculate(const InputParameter<DOFs, CustomVector>& inp, Trajectory<DOFs, CustomVector>& traj, double delta_time, bool& was_interrupted) {
        was_interrupted = false;
#if defined WITH_CLOUD_CLIENT
        traj.resize(0);
#endif

        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            auto& p = traj.profiles[0][dof];

            inp_min_velocity[dof] = inp.min_velocity ? inp.min_velocity.value()[dof] : -inp.max_velocity[dof];
            inp_min_acceleration[dof] = inp.min_acceleration ? inp.min_acceleration.value()[dof] : -inp.max_acceleration[dof];
            inp_per_dof_control_interface[dof] = inp.per_dof_control_interface ? inp.per_dof_control_interface.value()[dof] : inp.control_interface;
            inp_per_dof_synchronization[dof] = inp.per_dof_synchronization ? inp.per_dof_synchronization.value()[dof] : inp.synchronization;

            if (!inp.enabled[dof]) {
                p.p.back() = inp.current_position[dof];
                p.v.back() = inp.current_velocity[dof];
                p.a.back() = inp.current_acceleration[dof];
                p.t_sum.back() = 0.0;
                blocks[dof].t_min = 0.0;
                blocks[dof].a = std::nullopt;
                blocks[dof].b = std::nullopt;
                continue;
            }

            // Calculate brake (if input exceeds or will exceed limits)
            switch (inp_per_dof_control_interface[dof]) {
                case ControlInterface::Position: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        p.brake.get_position_brake_trajectory(inp.current_velocity[dof], inp.current_acceleration[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                        // p.accel.get_position_brake_trajectory(inp.target_velocity[dof], inp.target_acceleration[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                    } else if (!std::isinf(inp.max_acceleration[dof])) {
                        p.brake.get_second_order_position_brake_trajectory(inp.current_velocity[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                        // p.accel.get_second_order_position_brake_trajectory(inp.target_velocity[dof], inp.target_acceleration[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                    }
                    p.set_boundary(inp.current_position[dof], inp.current_velocity[dof], inp.current_acceleration[dof], inp.target_position[dof], inp.target_velocity[dof], inp.target_acceleration[dof]);
                } break;
                case ControlInterface::Velocity: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        p.brake.get_velocity_brake_trajectory(inp.current_acceleration[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                        // p.accel.get_velocity_brake_trajectory(inp.target_acceleration[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                    } else {
                        p.brake.get_second_order_velocity_brake_trajectory();
                        // p.accel.get_second_order_velocity_brake_trajectory();
                    }
                    p.set_boundary_for_velocity(inp.current_position[dof], inp.current_velocity[dof], inp.current_acceleration[dof], inp.target_velocity[dof], inp.target_acceleration[dof]);
                } break;
            }

            // Finalize pre & post-trajectories
            if (!std::isinf(inp.max_jerk[dof])) {
                p.brake.finalize(p.p[0], p.v[0], p.a[0]);
                // p.accel.finalize(p.pf, p.vf, p.af);
            } else if (!std::isinf(inp.max_acceleration[dof])) {
                p.brake.finalize_second_order(p.p[0], p.v[0], p.a[0]);
                // p.accel.finalize_second_order(p.pf, p.vf, p.af);
            }

            bool found_profile {false};
            switch (inp_per_dof_control_interface[dof]) {
                case ControlInterface::Position: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        PositionThirdOrderStep1 step1 {p.p[0], p.v[0], p.a[0], p.pf, p.vf, p.af, inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]};
                        found_profile = step1.get_profile(p, blocks[dof]);
                    } else if (!std::isinf(inp.max_acceleration[dof])) {
                        PositionSecondOrderStep1 step1 {p.p[0], p.v[0], p.pf, p.vf, inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]};
                        found_profile = step1.get_profile(p, blocks[dof]);
                    } else {
                        PositionFirstOrderStep1 step1 {p.p[0], p.pf, inp.max_velocity[dof], inp_min_velocity[dof]};
                        found_profile = step1.get_profile(p, blocks[dof]);
                    }
                } break;
                case ControlInterface::Velocity: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        VelocityThirdOrderStep1 step1 {p.v[0], p.a[0], p.vf, p.af, inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]};
                        found_profile = step1.get_profile(p, blocks[dof]);
                    } else {
                        VelocitySecondOrderStep1 step1 {p.v[0], p.vf, inp.max_acceleration[dof], inp_min_acceleration[dof]};
                        found_profile = step1.get_profile(p, blocks[dof]);
                    }
                } break;
            }

            if (!found_profile) {
                const bool has_zero_limits = (inp.max_acceleration[dof] == 0.0 || inp_min_acceleration[dof] == 0.0 || inp.max_jerk[dof] == 0.0);
                if (has_zero_limits) {
                    if constexpr (throw_error) {
                        throw RuckigError("zero limits conflict in step 1, dof: " + std::to_string(dof) + " input: " + inp.to_string());
                    } else {
                        return Result::ErrorZeroLimits;
                    }

                } else {
                    if constexpr (throw_error) {
                        throw RuckigError("error in step 1, dof: " + std::to_string(dof) + " input: " + inp.to_string());
                    } else {
                        return Result::ErrorExecutionTimeCalculation;
                    }
                }
            }

            traj.independent_min_durations[dof] = blocks[dof].t_min;
            // std::cout << dof << " profile step1: " << blocks[dof].to_string() << std::endl;
        }

        const bool discrete_duration = (inp.duration_discretization == DurationDiscretization::Discrete);
        if (degrees_of_freedom == 1 && !inp.minimum_duration && !discrete_duration) {
            traj.duration = blocks[0].t_min;
            traj.profiles[0][0] = blocks[0].p_min;
            traj.cumulative_times[0] = traj.duration;
            return Result::Working;
        }

        std::optional<size_t> limiting_dof; // The DoF that doesn't need step 2
        const bool found_synchronization = synchronize(inp.minimum_duration, traj.duration, limiting_dof, traj.profiles[0], discrete_duration, delta_time);
        if (!found_synchronization) {
            bool has_zero_limits = false;
            for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
                if (inp.max_acceleration[dof] == 0.0 || inp_min_acceleration[dof] == 0.0 || inp.max_jerk[dof] == 0.0) {
                    has_zero_limits = true;
                    break;
                }
            }

            if (has_zero_limits) {
                if constexpr (throw_error) {
                    throw RuckigError("zero limits conflict with other degrees of freedom in time synchronization " + std::to_string(traj.duration));
                } else {
                    return Result::ErrorZeroLimits;
                }

            } else {
                if constexpr (throw_error) {
                    throw RuckigError("error in time synchronization: " + std::to_string(traj.duration));
                } else {
                    return Result::ErrorSynchronizationCalculation;
                }
            }
        }

        // None Synchronization
        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            if (inp.enabled[dof] && inp_per_dof_synchronization[dof] == Synchronization::None) {
                traj.profiles[0][dof] = blocks[dof].p_min;
                if (blocks[dof].t_min > traj.duration) {
                    traj.duration = blocks[dof].t_min;
                    limiting_dof = dof;
                }
            }
        }
        traj.cumulative_times[0] = traj.duration;

        if constexpr (return_error_at_maximal_duration) {
            if (traj.duration > 7.6e3) {
                return Result::ErrorTrajectoryDuration;
            }
        }

        if (traj.duration == 0.0) {
            // Copy all profiles for end state
            for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
                traj.profiles[0][dof] = blocks[dof].p_min;
            }
            return Result::Working;
        }

        if (!discrete_duration && std::all_of(inp_per_dof_synchronization.begin(), inp_per_dof_synchronization.end(), [](Synchronization s){ return s == Synchronization::None; })) {
            return Result::Working;
        }

        // Phase Synchronization
        if (limiting_dof && std::any_of(inp_per_dof_synchronization.begin(), inp_per_dof_synchronization.end(), [](Synchronization s){ return s == Synchronization::Phase; })) {
            const Profile& p_limiting = traj.profiles[0][limiting_dof.value()];
            if (is_input_collinear(inp, p_limiting.direction, limiting_dof.value())) {
                bool found_time_synchronization {true};
                for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
                    if (!inp.enabled[dof] || dof == limiting_dof || inp_per_dof_synchronization[dof] != Synchronization::Phase) {
                        continue;
                    }

                    Profile& p = traj.profiles[0][dof];
                    const double t_profile = traj.duration - p.brake.duration - p.accel.duration;

                    p.t = p_limiting.t; // Copy timing information from limiting DoF
                    p.control_signs = p_limiting.control_signs;

                    // Profile::ReachedLimits::NONE is a small hack, as there is no specialization for that in the check function
                    switch (inp_per_dof_control_interface[dof]) {
                        case ControlInterface::Position: {
                            switch (p.control_signs) {
                                case Profile::ControlSigns::UDDU: {
                                    if (!std::isinf(inp.max_jerk[dof])) {
                                        found_time_synchronization &= p.check_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                                    } else if (!std::isinf(inp.max_acceleration[dof])) {
                                        found_time_synchronization &= p.check_for_second_order_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], -new_phase_control[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                                    } else {
                                        found_time_synchronization &= p.check_for_first_order_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_velocity[dof], inp_min_velocity[dof]);
                                    }
                                } break;
                                case Profile::ControlSigns::UDUD: {
                                    if (!std::isinf(inp.max_jerk[dof])) {
                                        found_time_synchronization &= p.check_with_timing<Profile::ControlSigns::UDUD, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                                    } else {
                                        found_time_synchronization &= p.check_for_second_order_with_timing<Profile::ControlSigns::UDUD, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], -new_phase_control[dof], inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                                    }
                                } break;
                            }
                        } break;
                        case ControlInterface::Velocity: {
                            switch (p.control_signs) {
                                case Profile::ControlSigns::UDDU: {
                                    if (!std::isinf(inp.max_jerk[dof])) {
                                        found_time_synchronization &= p.check_for_velocity_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                                    } else {
                                        found_time_synchronization &= p.check_for_second_order_velocity_with_timing<Profile::ControlSigns::UDDU, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                                    }
                                } break;
                                case Profile::ControlSigns::UDUD: {
                                    if (!std::isinf(inp.max_jerk[dof])) {
                                        found_time_synchronization &= p.check_for_velocity_with_timing<Profile::ControlSigns::UDUD, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]);
                                    } else {
                                        found_time_synchronization &= p.check_for_second_order_velocity_with_timing<Profile::ControlSigns::UDUD, Profile::ReachedLimits::NONE>(t_profile, new_phase_control[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]);
                                    }
                                } break;
                            }
                        } break;
                    }

                    p.limits = p_limiting.limits; // After check method call to set correct limits
                }

                if (found_time_synchronization && std::all_of(inp_per_dof_synchronization.begin(), inp_per_dof_synchronization.end(), [](Synchronization s){ return s == Synchronization::Phase || s == Synchronization::None; })) {
                    return Result::Working;
                }
            }
        }

        // Time Synchronization
        for (size_t dof = 0; dof < degrees_of_freedom; ++dof) {
            const bool skip_synchronization = (dof == limiting_dof || inp_per_dof_synchronization[dof] == Synchronization::None) && !discrete_duration;
            if (!inp.enabled[dof] || skip_synchronization) {
                continue;
            }

            Profile& p = traj.profiles[0][dof];
            const double t_profile = traj.duration - p.brake.duration - p.accel.duration;

            if (inp_per_dof_synchronization[dof] == Synchronization::TimeIfNecessary && std::abs(inp.target_velocity[dof]) < eps && std::abs(inp.target_acceleration[dof]) < eps) {
                p = blocks[dof].p_min;
                continue;
            }

            // Check if the final time corresponds to an extremal profile calculated in step 1
            // Use 2*eps because of numerical robustness in duration discretization
            if (std::abs(t_profile - blocks[dof].t_min) < 2*eps) {
                p = blocks[dof].p_min;
                continue;
            } else if (blocks[dof].a && std::abs(t_profile - blocks[dof].a->right) < 2*eps) {
                p = blocks[dof].a->profile;
                continue;
            } else if (blocks[dof].b && std::abs(t_profile - blocks[dof].b->right) < 2*eps) {
                p = blocks[dof].b->profile;
                continue;
            }

            bool found_time_synchronization {false};
            switch (inp_per_dof_control_interface[dof]) {
                case ControlInterface::Position: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        PositionThirdOrderStep2 step2 {t_profile, p.p[0], p.v[0], p.a[0], p.pf, p.vf, p.af, inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]};
                        found_time_synchronization = step2.get_profile(p);
                    } else if (!std::isinf(inp.max_acceleration[dof])) {
                        PositionSecondOrderStep2 step2 {t_profile, p.p[0], p.v[0], p.pf, p.vf, inp.max_velocity[dof], inp_min_velocity[dof], inp.max_acceleration[dof], inp_min_acceleration[dof]};
                        found_time_synchronization = step2.get_profile(p);
                    } else {
                        PositionFirstOrderStep2 step2 {t_profile, p.p[0], p.pf, inp.max_velocity[dof], inp_min_velocity[dof]};
                        found_time_synchronization = step2.get_profile(p);
                    }
                } break;
                case ControlInterface::Velocity: {
                    if (!std::isinf(inp.max_jerk[dof])) {
                        VelocityThirdOrderStep2 step2 {t_profile, p.v[0], p.a[0], p.vf, p.af, inp.max_acceleration[dof], inp_min_acceleration[dof], inp.max_jerk[dof]};
                        found_time_synchronization = step2.get_profile(p);
                    } else {
                        VelocitySecondOrderStep2 step2 {t_profile, p.v[0], p.vf, inp.max_acceleration[dof], inp_min_acceleration[dof]};
                        found_time_synchronization = step2.get_profile(p);
                    }
                } break;
            }
            if (!found_time_synchronization) {
                if constexpr (throw_error) {
                    throw RuckigError("error in step 2 in dof: " + std::to_string(dof) + " for t sync: " + std::to_string(traj.duration) + " input: " + inp.to_string());
                } else {
                    return Result::ErrorSynchronizationCalculation;
                }
            }
            // std::cout << dof << " profile step2: " << p.to_string() << std::endl;
        }

        return Result::Working;
    }